

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

int __thiscall
QSslSocketPrivate::bind(QSslSocketPrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined1 uVar1;
  quint16 qVar2;
  qintptr qVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  bool ret;
  QSslSocketPrivate *in_stack_00000050;
  OpenMode in_stack_000000dc;
  undefined4 in_stack_ffffffffffffffa8;
  OpenModeFlag in_stack_ffffffffffffffac;
  QAbstractSocket *in_stack_ffffffffffffffb0;
  QHostAddress *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QHostAddress local_20;
  socklen_t local_14;
  socklen_t local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = __len;
  if (((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f & 1) == 0) {
    init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd));
  }
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  if (this->plainSocket == (QTcpSocket *)0x0) {
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac);
    createPlainSocket(in_stack_00000050,in_stack_000000dc);
  }
  local_14 = local_c;
  uVar1 = (**(code **)(*(long *)&this->plainSocket->super_QAbstractSocket + 0xf0))
                    (this->plainSocket,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd),
                     (ulong)__addr & 0xffff,local_c);
  qVar2 = QAbstractSocket::localPort(in_stack_ffffffffffffffb0);
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.localPort = qVar2;
  this_00 = &local_20;
  QAbstractSocket::localAddress
            ((QAbstractSocket *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  QHostAddress::operator=
            (this_00,(QHostAddress *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QHostAddress::~QHostAddress((QHostAddress *)0x3a6436);
  qVar3 = (**(code **)(*(long *)&this->plainSocket->super_QAbstractSocket + 0x110))();
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.cachedSocketDescriptor = qVar3;
  *(undefined4 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xac = 0;
  *(undefined4 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0xa8 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar1) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocketPrivate::bind(const QHostAddress &address, quint16 port, QAbstractSocket::BindMode mode)
{
    // this function is called from QAbstractSocket::bind
    if (!initialized)
        init();
    initialized = false;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::bind(" << address << ',' << port << ',' << mode << ')';
#endif
    if (!plainSocket) {
#ifdef QSSLSOCKET_DEBUG
        qCDebug(lcSsl) << "\tcreating internal plain socket";
#endif
        createPlainSocket(QIODevice::ReadWrite);
    }
    bool ret = plainSocket->bind(address, port, mode);
    localPort = plainSocket->localPort();
    localAddress = plainSocket->localAddress();
    cachedSocketDescriptor = plainSocket->socketDescriptor();
    readChannelCount = writeChannelCount = 0;
    return ret;
}